

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numpy.h
# Opt level: O1

object pybind11::dtype::_dtype_from_pep3118(void)

{
  PyObject *pPVar1;
  int iVar2;
  object *poVar3;
  handle in_RDI;
  PyObject *tmp;
  handle local_48;
  object local_40;
  accessor<pybind11::detail::accessor_policies::str_attr> local_38;
  
  if (_dtype_from_pep3118()::obj == '\0') {
    iVar2 = __cxa_guard_acquire(&_dtype_from_pep3118()::obj);
    if (iVar2 != 0) {
      module_::import((module_ *)&local_48,"numpy.core._internal");
      local_38.obj.m_ptr = local_48.m_ptr;
      local_38.key = "_dtype_from_pep3118";
      local_38.cache.super_handle.m_ptr = (handle)(PyObject *)0x0;
      poVar3 = detail::accessor<pybind11::detail::accessor_policies::str_attr>::get_cache(&local_38)
      ;
      pPVar1 = (poVar3->super_handle).m_ptr;
      if (pPVar1 != (PyObject *)0x0) {
        pPVar1->ob_refcnt = pPVar1->ob_refcnt + 1;
      }
      local_40.super_handle.m_ptr = (handle)(PyObject *)0x0;
      object::~object(&local_40);
      object::~object(&local_38.cache);
      object::~object((object *)&local_48);
      _dtype_from_pep3118::obj = pPVar1;
      __cxa_guard_release(&_dtype_from_pep3118()::obj);
    }
  }
  pPVar1 = _dtype_from_pep3118::obj;
  (in_RDI.m_ptr)->ob_refcnt = (Py_ssize_t)_dtype_from_pep3118::obj;
  if (pPVar1 != (PyObject *)0x0) {
    pPVar1->ob_refcnt = pPVar1->ob_refcnt + 1;
  }
  return (object)(handle)in_RDI.m_ptr;
}

Assistant:

static object _dtype_from_pep3118() {
        static PyObject *obj = module_::import("numpy.core._internal")
            .attr("_dtype_from_pep3118").cast<object>().release().ptr();
        return reinterpret_borrow<object>(obj);
    }